

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchmanager.cpp
# Opt level: O0

void __thiscall QEvdevTouchManager::addDevice(QEvdevTouchManager *this,QString *deviceNode)

{
  bool bVar1;
  undefined8 uVar2;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  __single_object handler;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  qsizetype *handler_00;
  QMessageLogger *in_stack_ffffffffffffff50;
  offset_in_QEvdevTouchManager_to_subr *in_stack_ffffffffffffff80;
  ContextType *in_stack_ffffffffffffff88;
  Object *in_stack_ffffffffffffff90;
  Connection local_48 [8];
  undefined8 local_40;
  char local_38 [8];
  ConnectionType in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEvdevTouch();
  anon_unknown.dwarf_141487::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_141487::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x13e893);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (char *)0x13e8ac);
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_38,"evdevtouch: Adding device at %ls",uVar2);
    local_10 = 0;
  }
  local_40 = 0xaaaaaaaaaaaaaaaa;
  std::make_unique<QEvdevTouchScreenHandlerThread,QString_const&,QString&>
            (in_RDI,(QString *)in_stack_ffffffffffffff50);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                      *)0x13e918);
  if (bVar1) {
    std::
    unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
    ::get((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
           *)0x13e92e);
    uVar3 = 0;
    QObject::connect<void(QEvdevTouchScreenHandlerThread::*)(),void(QEvdevTouchManager::*)()>
              (in_stack_ffffffffffffff90,0,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffffd0);
    QMetaObject::Connection::~Connection(local_48);
    handler_00 = &in_RDI[1].d.size;
    std::
    unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
    ::unique_ptr((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                  *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,uVar3));
    QtInputSupport::DeviceHandlerList<QEvdevTouchScreenHandlerThread>::add
              ((DeviceHandlerList<QEvdevTouchScreenHandlerThread> *)in_RDI,in_RSI,
               (unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                *)handler_00);
    std::
    unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
    ::~unique_ptr((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    QtPrivate::asString(in_RSI);
    uVar2 = QString::utf16();
    QMessageLogger::warning
              (&stack0xffffffffffffff80,"evdevtouch: Failed to open touch device %ls",uVar2);
  }
  std::
  unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>::
  ~unique_ptr((unique_ptr<QEvdevTouchScreenHandlerThread,_std::default_delete<QEvdevTouchScreenHandlerThread>_>
               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTouchManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTouch, "evdevtouch: Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTouchScreenHandlerThread>(deviceNode, m_spec);
    if (handler) {
        connect(handler.get(), &QEvdevTouchScreenHandlerThread::touchDeviceRegistered, this, &QEvdevTouchManager::updateInputDeviceCount);
        m_activeDevices.add(deviceNode, std::move(handler));
    } else {
        qWarning("evdevtouch: Failed to open touch device %ls", qUtf16Printable(deviceNode));
    }
}